

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_PointerTuple.cpp
# Opt level: O1

Type_PointerTuple * __thiscall
Type_PointerTuple::operator=(Type_PointerTuple *this,Type_PointerTuple *o)

{
  Index IVar1;
  
  if (this != o) {
    (this->super_Type)._m_sc = (o->super_Type)._m_sc;
    this->_m_pred = o->_m_pred;
    IVar1 = o->_m_oI;
    this->_m_aI = o->_m_aI;
    this->_m_oI = IVar1;
  }
  return this;
}

Assistant:

Type_PointerTuple& Type_PointerTuple::operator= (const Type_PointerTuple& o)
{
    if (this == &o) return *this;   // Gracefully handle self assignment
    // Put the normal assignment duties here...
    Type::operator=(o);
    _m_pred = o._m_pred;
    _m_aI = o._m_aI;
    _m_oI = o._m_oI;
    return *this;
}